

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

void kj::UnixEventPort::registerSignalHandler(int signum)

{
  int iVar1;
  Fault f_4;
  Fault f;
  sigset_t local_120;
  int local_a0;
  sigset_t mask;
  
  if (((uint)signum < 0xc) && ((0x990U >> (signum & 0x1fU) & 1) != 0)) {
    mask.__val[0]._0_1_ = 0;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[93]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xba,FAILED,
               "signum != SIGBUS && signum != SIGFPE && signum != SIGILL && signum != SIGSEGV",
               "_kjCondition,\"this signal is raised by erroneous code execution; you cannot capture it into the event \" \"loop\""
               ,(bool *)&mask,
               (char (*) [93])
               "this signal is raised by erroneous code execution; you cannot capture it into the event loop"
              );
    kj::_::Debug::Fault::fatal(&f);
  }
  (anonymous_namespace)::tooLateToSetReserved = 1;
  do {
    iVar1 = sigemptyset((sigset_t *)&mask);
    if (-1 < iVar1) goto LAB_00364aac;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xc1,iVar1,"sigemptyset(&mask)","");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_00364aac:
  do {
    iVar1 = sigaddset((sigset_t *)&mask,signum);
    if (-1 < iVar1) goto LAB_00364ad3;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xc2,iVar1,"sigaddset(&mask, signum)","");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_00364ad3:
  do {
    iVar1 = pthread_sigmask(0,(__sigset_t *)&mask,(__sigset_t *)0x0);
    if (-1 < iVar1) goto LAB_00364afc;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xc3,iVar1,"pthread_sigmask(SIG_BLOCK, &mask, nullptr)","");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_00364afc:
  memset(&local_120,0,0x90);
  f.exception = (Exception *)signalHandler;
  local_a0 = 4;
  do {
    iVar1 = sigfillset(&local_120);
    if (-1 < iVar1) goto LAB_00364b46;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f_4,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xce,iVar1,"sigfillset(&action.sa_mask)","");
    kj::_::Debug::Fault::fatal(&f_4);
  }
LAB_00364b46:
  do {
    iVar1 = sigdelset(&local_120,7);
    if (-1 < iVar1) goto LAB_00364b69;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f_4,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xcf,iVar1,"sigdelset(&action.sa_mask, SIGBUS)","");
    kj::_::Debug::Fault::fatal(&f_4);
  }
LAB_00364b69:
  do {
    iVar1 = sigdelset(&local_120,8);
    if (-1 < iVar1) goto LAB_00364b8c;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f_4,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xd0,iVar1,"sigdelset(&action.sa_mask, SIGFPE)","");
    kj::_::Debug::Fault::fatal(&f_4);
  }
LAB_00364b8c:
  do {
    iVar1 = sigdelset(&local_120,4);
    if (-1 < iVar1) goto LAB_00364baf;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f_4,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xd1,iVar1,"sigdelset(&action.sa_mask, SIGILL)","");
    kj::_::Debug::Fault::fatal(&f_4);
  }
LAB_00364baf:
  do {
    iVar1 = sigdelset(&local_120,0xb);
    if (-1 < iVar1) goto LAB_00364bd2;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f_4,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xd2,iVar1,"sigdelset(&action.sa_mask, SIGSEGV)","");
    kj::_::Debug::Fault::fatal(&f_4);
  }
LAB_00364bd2:
  do {
    iVar1 = sigaction(signum,(sigaction *)&f,(sigaction *)0x0);
    if (-1 < iVar1) {
      return;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    return;
  }
  kj::_::Debug::Fault::Fault
            (&f_4,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
             ,0xd4,iVar1,"sigaction(signum, &action, nullptr)","");
  kj::_::Debug::Fault::fatal(&f_4);
}

Assistant:

void UnixEventPort::registerSignalHandler(int signum) {
  KJ_REQUIRE(signum != SIGBUS && signum != SIGFPE && signum != SIGILL && signum != SIGSEGV,
      "this signal is raised by erroneous code execution; you cannot capture it into the event "
      "loop");

  tooLateToSetReserved = true;

  // Block the signal from being delivered most of the time. We'll explicitly unblock it when we
  // want to receive it.
  sigset_t mask;
  KJ_SYSCALL(sigemptyset(&mask));
  KJ_SYSCALL(sigaddset(&mask, signum));
  KJ_SYSCALL(pthread_sigmask(SIG_BLOCK, &mask, nullptr));

  // Register the signal handler which should be invoked when we explicitly unblock the signal.
  struct sigaction action;
  memset(&action, 0, sizeof(action));
  action.sa_sigaction = &signalHandler;
  action.sa_flags = SA_SIGINFO;

  // Set up the signal mask applied while the signal handler runs. We want to block all other
  // signals from being raised during the handler, with the exception of the four "crash" signals,
  // which realistically can't be blocked.
  KJ_SYSCALL(sigfillset(&action.sa_mask));
  KJ_SYSCALL(sigdelset(&action.sa_mask, SIGBUS));
  KJ_SYSCALL(sigdelset(&action.sa_mask, SIGFPE));
  KJ_SYSCALL(sigdelset(&action.sa_mask, SIGILL));
  KJ_SYSCALL(sigdelset(&action.sa_mask, SIGSEGV));

  KJ_SYSCALL(sigaction(signum, &action, nullptr));
}